

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

array_container_t * array_container_from_bitset(bitset_container_t *bits)

{
  uint64_t *array;
  uint16_t *vout;
  long lVar1;
  ushort uVar2;
  uint uVar3;
  array_container_t *paVar4;
  size_t i;
  long lVar5;
  int iVar6;
  uint64_t uVar7;
  uint16_t *puVar8;
  
  paVar4 = array_container_create_given_capacity(bits->cardinality);
  paVar4->cardinality = bits->cardinality;
  uVar3 = croaring_hardware_support();
  array = bits->words;
  vout = paVar4->array;
  if ((uVar3 & 2) == 0) {
    uVar2 = 0;
    lVar5 = 0;
    iVar6 = 0;
    do {
      uVar7 = array[lVar5];
      if (uVar7 != 0) {
        puVar8 = vout + iVar6;
        do {
          lVar1 = 0;
          if (uVar7 != 0) {
            for (; (uVar7 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
            }
          }
          *puVar8 = (ushort)lVar1 | uVar2;
          puVar8 = puVar8 + 1;
          iVar6 = iVar6 + 1;
          uVar7 = uVar7 & uVar7 - 1;
        } while (uVar7 != 0);
      }
      uVar2 = uVar2 + 0x40;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x400);
  }
  else {
    bitset_extract_setbits_avx512_uint16(array,0x400,vout,(long)bits->cardinality,0);
  }
  return paVar4;
}

Assistant:

array_container_t *array_container_from_bitset(const bitset_container_t *bits) {
    array_container_t *result =
        array_container_create_given_capacity(bits->cardinality);
    result->cardinality = bits->cardinality;
#if CROARING_IS_X64
#if CROARING_COMPILER_SUPPORTS_AVX512
    if (croaring_hardware_support() & ROARING_SUPPORTS_AVX512) {
        bitset_extract_setbits_avx512_uint16(
            bits->words, BITSET_CONTAINER_SIZE_IN_WORDS, result->array,
            bits->cardinality, 0);
    } else
#endif
    {
        //  sse version ends up being slower here
        // (bitset_extract_setbits_sse_uint16)
        // because of the sparsity of the data
        bitset_extract_setbits_uint16(
            bits->words, BITSET_CONTAINER_SIZE_IN_WORDS, result->array, 0);
    }
#else
    // If the system is not x64, then we have no accelerated function.
    bitset_extract_setbits_uint16(bits->words, BITSET_CONTAINER_SIZE_IN_WORDS,
                                  result->array, 0);
#endif

    return result;
}